

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O3

uint Saig_StrSimHash(Aig_Obj_t *pObj)

{
  int *piVar1;
  undefined1 auVar2 [16];
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  lVar3 = 0;
  do {
    piVar1 = (int *)((long)(pObj->field_5).pData + lVar3);
    auVar2 = *(undefined1 (*) [16])((long)Saig_StrSimHash::s_SPrimes + lVar3);
    uVar4 = uVar4 ^ auVar2._0_4_ * *piVar1;
    uVar5 = uVar5 ^ auVar2._4_4_ * piVar1[1];
    uVar6 = uVar6 ^ (uint)((auVar2._8_8_ & 0xffffffff) * (ulong)(uint)piVar1[2]);
    uVar7 = uVar7 ^ auVar2._12_4_ * piVar1[3];
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  return uVar7 ^ uVar5 ^ uVar6 ^ uVar4;
}

Assistant:

unsigned Saig_StrSimHash( Aig_Obj_t * pObj )
{
    static int s_SPrimes[128] = {
        1009, 1049, 1093, 1151, 1201, 1249, 1297, 1361, 1427, 1459,
        1499, 1559, 1607, 1657, 1709, 1759, 1823, 1877, 1933, 1997,
        2039, 2089, 2141, 2213, 2269, 2311, 2371, 2411, 2467, 2543,
        2609, 2663, 2699, 2741, 2797, 2851, 2909, 2969, 3037, 3089,
        3169, 3221, 3299, 3331, 3389, 3461, 3517, 3557, 3613, 3671,
        3719, 3779, 3847, 3907, 3943, 4013, 4073, 4129, 4201, 4243,
        4289, 4363, 4441, 4493, 4549, 4621, 4663, 4729, 4793, 4871,
        4933, 4973, 5021, 5087, 5153, 5227, 5281, 5351, 5417, 5471,
        5519, 5573, 5651, 5693, 5749, 5821, 5861, 5923, 6011, 6073,
        6131, 6199, 6257, 6301, 6353, 6397, 6481, 6563, 6619, 6689,
        6737, 6803, 6863, 6917, 6977, 7027, 7109, 7187, 7237, 7309,
        7393, 7477, 7523, 7561, 7607, 7681, 7727, 7817, 7877, 7933,
        8011, 8039, 8059, 8081, 8093, 8111, 8123, 8147
    };
    unsigned * pSims;
    unsigned uHash = 0;
    int i;
    assert( SAIG_WORDS <= 128 );
    pSims = (unsigned *)pObj->pData;
    for ( i = 0; i < SAIG_WORDS; i++ )
        uHash ^= pSims[i] * s_SPrimes[i & 0x7F];
    return uHash;
}